

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cfd::core::Deserializer::ReadBuffer
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Deserializer *this,uint32_t size)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar *__dest;
  uchar *puVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__n;
  uint32_t size_local;
  Deserializer *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  __n = __return_storage_ptr__;
  CheckReadSize(this,(ulong)size);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)size;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3e7de8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_00,(size_type)__n,(allocator_type *)this);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3e7e04);
  __dest = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e7e0d);
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e7e1e);
  memcpy(__dest,puVar1 + this->offset_,(ulong)size);
  this->offset_ = size + this->offset_;
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Deserializer::ReadBuffer(uint32_t size) {
  CheckReadSize(size);
  std::vector<uint8_t> result(size);
  memcpy(result.data(), &buffer_.data()[offset_], size);
  offset_ += size;
  return result;
}